

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O0

void __thiscall QueryCompiler::QueryCompiler(QueryCompiler *this,shared_ptr<TreeDecomposition> *td)

{
  shared_ptr<TreeDecomposition> *in_RSI;
  shared_ptr<TreeDecomposition> *in_RDI;
  
  std::shared_ptr<TreeDecomposition>::shared_ptr(in_RSI,in_RDI);
  std::vector<Query_*,_std::allocator<Query_*>_>::vector
            ((vector<Query_*,_std::allocator<Query_*>_> *)0x316749);
  std::vector<View_*,_std::allocator<View_*>_>::vector
            ((vector<View_*,_std::allocator<View_*>_> *)0x316756);
  std::vector<Function_*,_std::allocator<Function_*>_>::vector
            ((vector<Function_*,_std::allocator<Function_*>_> *)0x316763);
  std::
  unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
  ::unordered_map((unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
                   *)0x316770);
  std::
  unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
  ::unordered_map((unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                   *)0x316780);
  return;
}

Assistant:

QueryCompiler::QueryCompiler(shared_ptr<TreeDecomposition> td) : _td(td)
{
}